

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::LargeHeapBlock::RescanOnePage(LargeHeapBlock *this,Recycler *recycler,RescanFlags flags)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  size_t sVar4;
  undefined4 *puVar5;
  LargeObjectHeader *pLVar6;
  char *page;
  void *address;
  size_t sStack_58;
  bool noOOMDuringMark;
  size_t objectSize;
  uchar attributes;
  char *objectAddress;
  LargeObjectHeader *header_1;
  uint objectIndex;
  bool hasWriteBarrier;
  LargeObjectHeader *header;
  bool oldNeedOOMRescan;
  RescanFlags flags_local;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  sVar4 = GetPageCount(this);
  if (sVar4 != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x4d0,"(this->GetPageCount() == 1)","this->GetPageCount() == 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = (this->super_HeapBlock).needOOMRescan;
  (this->super_HeapBlock).needOOMRescan = false;
  if ((bVar2 & 1U) == 0) {
    if ((recycler->inEndMarkOnLowMemory & 1U) != 0) {
      return false;
    }
    pLVar6 = GetHeaderByIndex(this,0);
    if (pLVar6 == (LargeObjectHeader *)0x0) {
      return false;
    }
    bVar3 = LargeObjectHeader::GetAttributes(pLVar6,this->heapInfo->recycler->Cookie);
    if ((bVar3 & 0x20) == 0x20) {
      return false;
    }
    bVar3 = pLVar6->field_0x1a;
    page = GetBeginAddress(this);
    bVar2 = IsPageDirty(this,page,flags,(bool)(bVar3 >> 1 & 1));
    if (!bVar2) {
      return false;
    }
  }
  (recycler->collectionStats).markData.rescanLargePageCount =
       (recycler->collectionStats).markData.rescanLargePageCount + 1;
  header_1._0_4_ = 0;
  do {
    if (this->allocCount <= (uint)header_1) {
      return true;
    }
    pLVar6 = GetHeaderByIndex(this,(uint)header_1);
    if (pLVar6 != (LargeObjectHeader *)0x0) {
      address = LargeObjectHeader::GetAddress(pLVar6);
      bVar2 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address);
      if (bVar2) {
        bVar3 = LargeObjectHeader::GetAttributes(pLVar6,this->heapInfo->recycler->Cookie);
        if (((bVar3 & 0x80) != 0) && ((bVar3 & 4) != 0)) {
          (recycler->collectionStats).finalizeCount = (recycler->collectionStats).finalizeCount + 1;
          LargeObjectHeader::SetAttributes(pLVar6,recycler->Cookie,bVar3 & 0xfb);
        }
        if ((bVar3 & 0x20) == 0) {
          (recycler->collectionStats).markData.rescanLargeObjectCount =
               (recycler->collectionStats).markData.rescanLargeObjectCount + 1;
          (recycler->collectionStats).markData.rescanLargeByteCount =
               pLVar6->objectSize + (recycler->collectionStats).markData.rescanLargeByteCount;
          sStack_58 = pLVar6->objectSize;
          bVar2 = InPageHeapMode(this);
          if (bVar2) {
            sStack_58 = HeapInfo::RoundObjectSize(sStack_58);
          }
          if (sStack_58 != 0) {
            if ((bVar3 & 0x10) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                 ,0x53d,"(!(attributes & TrackBit))","!(attributes & TrackBit)");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            bVar2 = Recycler::AddMark(recycler,address,sStack_58);
            if (!bVar2) {
              HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,recycler);
            }
          }
        }
      }
    }
    header_1._0_4_ = (uint)header_1 + 1;
  } while( true );
}

Assistant:

bool
LargeHeapBlock::RescanOnePage(Recycler * recycler)
#endif
{
    Assert(this->GetPageCount() == 1);
    bool const oldNeedOOMRescan = this->needOOMRescan;

    // Reset this, we'll increment this if we OOM again
    this->needOOMRescan = false;

#if ENABLE_CONCURRENT_GC
    // don't need to get the write watch bit if we already need to oom rescan
    if (!oldNeedOOMRescan)
    {
        if (recycler->inEndMarkOnLowMemory)
        {
            // we only do oom rescan if we are on low memory mark
            return false;
        }

        // Check the write watch bit to see if we need to rescan
        // REVIEW: large object size if bigger than one page, to use header index 0 here should be OK
        LargeObjectHeader* header = this->GetHeaderByIndex(0);
        if (header == nullptr) // not allocated or it's pending dispose or disposed
        {
            return false;
        }
        if((header->GetAttributes(this->heapInfo->recycler->Cookie) & LeafBit) == LeafBit)
        {
            return false;
        }
        bool hasWriteBarrier = false;
#ifdef RECYCLER_WRITE_BARRIER
        hasWriteBarrier = header->hasWriteBarrier;
#endif
        if (!IsPageDirty(this->GetBeginAddress(), flags, hasWriteBarrier))
        {
            return false;
        }
    }
#else
    // Shouldn't be rescanning in cases other than OOM if GetWriteWatch
    Assert(oldNeedOOMRescan);
#endif

    RECYCLER_STATS_INC(recycler, markData.rescanLargePageCount);

    for (uint objectIndex = 0; objectIndex < allocCount; objectIndex++)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);

        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        // it is not marked, don't rescan
        if (!recycler->heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(this->heapInfo->recycler->Cookie);

#ifdef RECYCLER_STATS
        if (((attributes & FinalizeBit) != 0) && ((attributes & NewFinalizeBit) != 0))
        {
            // The concurrent thread saw a false reference to this object and marked it before the attribute was set.
            // As such, our finalizeCount is not correct. Update it now.

            RECYCLER_STATS_INC(recycler, finalizeCount);
            header->SetAttributes(recycler->Cookie, (attributes & ~NewFinalizeBit));
        }
#endif

        // check whether the object is a leaf and doesn't need to be scanned
        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

        RECYCLER_STATS_INC(recycler, markData.rescanLargeObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanLargeByteCount, header->objectSize);

        size_t objectSize = header->objectSize;
#ifdef RECYCLER_PAGE_HEAP
        if (this->InPageHeapMode())
        {
            // trim off the trailing part which is not a pointer
            objectSize = HeapInfo::RoundObjectSize(objectSize);
        }
#endif
        if (objectSize > 0) // otherwise the object total size is less than a pointer size
        {
            bool noOOMDuringMark = true;
#ifdef RECYCLER_VISITED_HOST
            if (attributes & TrackBit)
            {
                noOOMDuringMark = recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddress));
                if (noOOMDuringMark)
                {
                    // Object has been successfully processed, so clear NewTrackBit
                    header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                    RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                }
            }
            else
#endif
            {
                Assert(!(attributes & TrackBit));
                noOOMDuringMark = recycler->AddMark(objectAddress, objectSize);
            }

            if (!noOOMDuringMark)
            {
                this->SetNeedOOMRescan(recycler);
            }
        }
    }
    return true;
}